

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O2

string * __thiscall
TokenScanner::nextToken_abi_cxx11_(string *__return_storage_ptr__,TokenScanner *this)

{
  StringCell *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  string *token;
  StringCell *cp;
  allocator local_69;
  string local_68;
  string local_48;
  
  this_00 = this->savedTokens;
  if (this_00 == (StringCell *)0x0) {
LAB_00106a82:
    if (this->ignoreWhitespaceFlag == true) {
      skipSpaces(this);
    }
    iVar2 = std::istream::get();
    if (iVar2 != 0x2f) {
      if (iVar2 == -1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_69);
        return __return_storage_ptr__;
      }
      if ((iVar2 == 0x22) || (iVar2 == 0x27)) {
        if (this->scanStringsFlag == true) {
          std::istream::unget();
          scanString_abi_cxx11_(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
      }
      else if ((iVar2 - 0x30U < 10) && (this->scanNumbersFlag == true)) {
        std::istream::unget();
        scanNumber_abi_cxx11_(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      goto LAB_00106b82;
    }
    if (this->ignoreCommentsFlag != true) goto LAB_00106b82;
    iVar3 = std::istream::get();
    if (iVar3 == 0x2a) {
      iVar2 = -1;
      do {
        iVar3 = std::istream::get();
        if (iVar3 == -1) break;
        bVar1 = iVar2 != 0x2a;
        iVar2 = iVar3;
      } while (iVar3 != 0x2f || bVar1);
      goto LAB_00106a82;
    }
    if (iVar3 == 0x2f) {
      do {
        do {
          iVar2 = std::istream::get();
        } while (0xe < iVar2 + 1U);
      } while ((0x4801U >> (iVar2 + 1U & 0x1f) & 1) == 0);
      goto LAB_00106a82;
    }
    if (iVar3 != -1) {
      std::istream::unget();
    }
LAB_00106b82:
    bVar1 = isWordCharacter(this,(char)iVar2);
    if (bVar1) {
      std::istream::unget();
      scanWord_abi_cxx11_(__return_storage_ptr__,this);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
      while( true ) {
        std::__cxx11::string::string((string *)&local_68,(string *)__return_storage_ptr__);
        bVar1 = isOperatorPrefix(this,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if ((!bVar1) || (iVar2 = std::istream::get(), iVar2 == -1)) break;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      while (1 < __return_storage_ptr__->_M_string_length) {
        std::__cxx11::string::string((string *)&local_48,(string *)__return_storage_ptr__);
        bVar1 = isOperator(this,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        if (bVar1) {
          return __return_storage_ptr__;
        }
        std::istream::unget();
        std::__cxx11::string::erase
                  ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this_00);
    this->savedTokens = this_00->link;
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x28);
  }
  return __return_storage_ptr__;
}

Assistant:

string TokenScanner::nextToken() {
   if (savedTokens != NULL) {
      StringCell *cp = savedTokens;
      string token = cp->str;
      savedTokens = cp->link;
      delete cp;
      return token;
   }
   while (true) {
      if (ignoreWhitespaceFlag) skipSpaces();
      int ch = isp->get();
      if (ch == '/' && ignoreCommentsFlag) {
         ch = isp->get();
         if (ch == '/') {
            while (true) {
               ch = isp->get();
               if (ch == '\n' || ch == '\r' || ch == EOF) break;
            }
            continue;
         } else if (ch == '*') {
            int prev = EOF;
            while (true) {
               ch = isp->get();
               if (ch == EOF || (prev == '*' && ch == '/')) break;
               prev = ch;
            }
            continue;
         }
         if (ch != EOF) isp->unget();
         ch = '/';
      }
      if (ch == EOF) return "";
      if ((ch == '"' || ch == '\'') && scanStringsFlag) {
         isp->unget();
         return scanString();
      }
      if (isdigit(ch) && scanNumbersFlag) {
         isp->unget();
         return scanNumber();
      }
      if (isWordCharacter(ch)) {
         isp->unget();
         return scanWord();
      }
      string op = string(1, ch);
      while (isOperatorPrefix(op)) {
         ch = isp->get();
         if (ch == EOF) break;
         op += ch;
      }
      while (op.length() > 1 && !isOperator(op)) {
         isp->unget();
         op.erase(op.length() - 1, 1);
      }
      return op;
   }
}